

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O2

void partial_fold(size_t len,__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3
                 ,__m128i *xmm_crc_part)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  undefined1 auVar8 [16];
  
  auVar1 = *(undefined1 (*) [16])(&DAT_0011f850 + len * 0x10);
  alVar7 = *xmm_crc0;
  auVar8[8] = 0x80;
  auVar8._0_8_ = 0x8080808080808080;
  auVar8[9] = 0x80;
  auVar8[10] = 0x80;
  auVar8[0xb] = 0x80;
  auVar8[0xc] = 0x80;
  auVar8[0xd] = 0x80;
  auVar8[0xe] = 0x80;
  auVar8[0xf] = 0x80;
  auVar8 = auVar1 ^ auVar8;
  alVar2 = (__m128i)vpshufb_avx((undefined1  [16])alVar7,auVar8);
  *xmm_crc0 = alVar2;
  auVar3 = vpshufb_avx((undefined1  [16])*xmm_crc1,auVar1);
  alVar2 = (__m128i)vpor_avx(auVar3,(undefined1  [16])alVar2);
  *xmm_crc0 = alVar2;
  alVar2 = (__m128i)vpshufb_avx((undefined1  [16])*xmm_crc1,auVar8);
  *xmm_crc1 = alVar2;
  auVar3 = vpshufb_avx((undefined1  [16])*xmm_crc2,auVar1);
  alVar2 = (__m128i)vpor_avx(auVar3,(undefined1  [16])alVar2);
  *xmm_crc1 = alVar2;
  alVar2 = (__m128i)vpshufb_avx((undefined1  [16])*xmm_crc2,auVar8);
  *xmm_crc2 = alVar2;
  auVar3 = vpshufb_avx((undefined1  [16])*xmm_crc3,auVar1);
  alVar2 = (__m128i)vpor_avx(auVar3,(undefined1  [16])alVar2);
  *xmm_crc2 = alVar2;
  alVar2 = (__m128i)vpshufb_avx((undefined1  [16])*xmm_crc3,auVar8);
  *xmm_crc3 = alVar2;
  alVar2 = (__m128i)vpshufb_avx((undefined1  [16])*xmm_crc_part,auVar1);
  *xmm_crc_part = alVar2;
  auVar3 = vpshufb_avx((undefined1  [16])alVar7,auVar1);
  auVar1 = vpor_avx((undefined1  [16])alVar2,(undefined1  [16])*xmm_crc3);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar3._0_8_;
  auVar8 = (undefined1  [16])0x0;
  for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
      auVar8 = auVar8 ^ ZEXT816(0x154442bd4) << uVar4;
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar3._8_8_;
  auVar3 = (undefined1  [16])0x0;
  for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x1c6e41596) << uVar4;
    }
  }
  alVar7 = (__m128i)vpternlogq_avx512vl(auVar3,auVar8,auVar1,0x96);
  *xmm_crc3 = alVar7;
  return;
}

Assistant:

static void partial_fold(const size_t len, __m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2,
                         __m128i *xmm_crc3, __m128i *xmm_crc_part) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    const __m128i xmm_mask3 = _mm_set1_epi32((int32_t)0x80808080);

    __m128i xmm_shl, xmm_shr, xmm_tmp1, xmm_tmp2, xmm_tmp3;
    __m128i xmm_a0_0, xmm_a0_1;
    __m128 ps_crc3, psa0_0, psa0_1, ps_res;

    xmm_shl = _mm_load_si128((__m128i *)(pshufb_shf_table + (4 * (len - 1))));
    xmm_shr = xmm_shl;
    xmm_shr = _mm_xor_si128(xmm_shr, xmm_mask3);

    xmm_a0_0 = _mm_shuffle_epi8(*xmm_crc0, xmm_shl);

    *xmm_crc0 = _mm_shuffle_epi8(*xmm_crc0, xmm_shr);
    xmm_tmp1 = _mm_shuffle_epi8(*xmm_crc1, xmm_shl);
    *xmm_crc0 = _mm_or_si128(*xmm_crc0, xmm_tmp1);

    *xmm_crc1 = _mm_shuffle_epi8(*xmm_crc1, xmm_shr);
    xmm_tmp2 = _mm_shuffle_epi8(*xmm_crc2, xmm_shl);
    *xmm_crc1 = _mm_or_si128(*xmm_crc1, xmm_tmp2);

    *xmm_crc2 = _mm_shuffle_epi8(*xmm_crc2, xmm_shr);
    xmm_tmp3 = _mm_shuffle_epi8(*xmm_crc3, xmm_shl);
    *xmm_crc2 = _mm_or_si128(*xmm_crc2, xmm_tmp3);

    *xmm_crc3 = _mm_shuffle_epi8(*xmm_crc3, xmm_shr);
    *xmm_crc_part = _mm_shuffle_epi8(*xmm_crc_part, xmm_shl);
    *xmm_crc3 = _mm_or_si128(*xmm_crc3, *xmm_crc_part);

    xmm_a0_1 = _mm_clmulepi64_si128(xmm_a0_0, xmm_fold4, 0x10);
    xmm_a0_0 = _mm_clmulepi64_si128(xmm_a0_0, xmm_fold4, 0x01);

    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    psa0_0 = _mm_castsi128_ps(xmm_a0_0);
    psa0_1 = _mm_castsi128_ps(xmm_a0_1);

    ps_res = _mm_xor_ps(ps_crc3, psa0_0);
    ps_res = _mm_xor_ps(ps_res, psa0_1);

    *xmm_crc3 = _mm_castps_si128(ps_res);
}